

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O0

void __thiscall
wasm::ParamUtils::localizeCallsTo::LocalizerPass::~LocalizerPass(LocalizerPass *this)

{
  LocalizerPass_conflict *this_local;
  
  ~LocalizerPass(this);
  operator_delete(this,0x160);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }